

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
CharacterInstance::receive
          (CharacterInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  CharacterInstance *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  CharacterInstance *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  CharacterInstance *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  __lhs = in_RDI;
  bVar1 = std::operator==(in_RDI,(char *)in_RDI);
  if (bVar1) {
    op_get(in_RDX,in_RCX);
  }
  else {
    bVar1 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar1) {
      op_set(in_stack_00000008,unaff_retaddr);
    }
    else {
      bVar1 = std::operator==(__lhs,(char *)in_RDI);
      if (bVar1) {
        op_isAlphabetic(in_stack_00000008,unaff_retaddr);
      }
      else {
        bVar1 = std::operator==(__lhs,(char *)in_RDI);
        if (bVar1) {
          op_isNumeric(in_stack_00000008,unaff_retaddr);
        }
        else {
          bVar1 = std::operator==(__lhs,(char *)in_RDI);
          if (bVar1) {
            op_isAlphanumeric(in_stack_00000008,unaff_retaddr);
          }
          else {
            bVar1 = std::operator==(__lhs,(char *)in_RDI);
            if (bVar1) {
              op_isSpace(in_stack_00000008,unaff_retaddr);
            }
            else {
              bVar1 = std::operator==(__lhs,(char *)in_RDI);
              if (bVar1) {
                op_isEqualTo(in_stack_00000048,in_stack_00000040);
              }
              else {
                bVar1 = std::operator==(__lhs,(char *)in_RDI);
                if (bVar1) {
                  op_isLessThan(in_stack_00000048,in_stack_00000040);
                }
                else {
                  bVar1 = std::operator==(__lhs,(char *)in_RDI);
                  if (bVar1) {
                    op_isLessThanOrEqualTo(in_stack_00000048,in_stack_00000040);
                  }
                  else {
                    bVar1 = std::operator==(__lhs,(char *)in_RDI);
                    if (bVar1) {
                      op_isGreaterThan(in_stack_00000048,in_stack_00000040);
                    }
                    else {
                      bVar1 = std::operator==(__lhs,(char *)in_RDI);
                      if (!bVar1) {
                        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                        *puVar2 = "RuntimeError: invalid message.";
                        __cxa_throw(puVar2,&char_const*::typeinfo,0);
                      }
                      op_isGreaterThanOrEqualTo(in_stack_00000048,in_stack_00000040);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __lhs;
}

Assistant:

std::string CharacterInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "set:")
        return op_set(arguments);
    if (message_name == "isAlphabetic?")
        return op_isAlphabetic(arguments);
    if (message_name == "isNumeric?")
        return op_isNumeric(arguments);
    if (message_name == "isAlphanumeric?")
        return op_isAlphanumeric(arguments);
    if (message_name == "isSpace?")
        return op_isSpace(arguments);
    if (message_name == "isEqualTo?")
        return op_isEqualTo(arguments);
    if (message_name == "isLessThan?")
        return op_isLessThan(arguments);
    if (message_name == "isLessThanOrEqualTo?")
        return op_isLessThanOrEqualTo(arguments);
    if (message_name == "isGreaterThan?")
        return op_isGreaterThan(arguments);
    if (message_name == "isGreaterThanOrEqualTo?")
        return op_isGreaterThanOrEqualTo(arguments);
    throw EXC_INVALID_MESSAGE;
}